

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O1

size_t * map_get_keys(pMap map)

{
  void *__dest;
  size_t *psVar1;
  size_t __size;
  
  __size = map->count << 3;
  __dest = malloc(__size);
  if (__dest != (void *)0x0) {
    psVar1 = (size_t *)memcpy(__dest,map->keys,__size);
    return psVar1;
  }
  perror("map_get_keys: malloc failed");
  return (size_t *)0x0;
}

Assistant:

size_t *map_get_keys(pMap map)
{
    size_t *res = malloc(map->count * sizeof(size_t));
    if (res == NULL)
    {
        perror("map_get_keys: malloc failed");
        return 0;
    }
    memcpy(res, map->keys, map->count * sizeof(size_t));
    return res;
}